

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Fts5HashScanEntry(Fts5Hash *pHash,char **pzTerm,u8 **ppDoclist,int *pnDoclist)

{
  Fts5HashEntry *p;
  int iVar1;
  size_t sVar2;
  
  p = pHash->pScan;
  if (p == (Fts5HashEntry *)0x0) {
    iVar1 = 0;
    *pzTerm = (char *)0x0;
    *ppDoclist = (u8 *)0x0;
  }
  else {
    sVar2 = strlen((char *)(p + 1));
    fts5HashAddPoslistSize(pHash,p,(Fts5HashEntry *)0x0);
    *pzTerm = (char *)(p + 1);
    *ppDoclist = (u8 *)((long)&p[1].pHashNext + (long)((int)sVar2 + 1));
    iVar1 = (p->nData - (int)sVar2) + -0x31;
  }
  *pnDoclist = iVar1;
  return;
}

Assistant:

static void sqlite3Fts5HashScanEntry(
  Fts5Hash *pHash,
  const char **pzTerm,            /* OUT: term (nul-terminated) */
  const u8 **ppDoclist,           /* OUT: pointer to doclist */
  int *pnDoclist                  /* OUT: size of doclist in bytes */
){
  Fts5HashEntry *p;
  if( (p = pHash->pScan) ){
    char *zKey = fts5EntryKey(p);
    int nTerm = (int)strlen(zKey);
    fts5HashAddPoslistSize(pHash, p, 0);
    *pzTerm = zKey;
    *ppDoclist = (const u8*)&zKey[nTerm+1];
    *pnDoclist = p->nData - (sizeof(Fts5HashEntry) + nTerm + 1);
  }else{
    *pzTerm = 0;
    *ppDoclist = 0;
    *pnDoclist = 0;
  }
}